

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O1

void __thiscall
QtPrivate::QMovableArrayOps<QMimeGlobPattern>::emplace<QMimeGlobPattern_const&>
          (QMovableArrayOps<QMimeGlobPattern> *this,qsizetype i,QMimeGlobPattern *args)

{
  QMimeGlobPattern **ppQVar1;
  qsizetype *pqVar2;
  QMimeGlobPattern *pQVar3;
  PatternType PVar4;
  undefined4 uVar5;
  long lVar6;
  Data *pDVar7;
  long lVar8;
  Data *pDVar9;
  char16_t *pcVar10;
  qsizetype qVar11;
  Data *pDVar12;
  char16_t *pcVar13;
  qsizetype qVar14;
  undefined4 uVar16;
  QMimeGlobPattern *pQVar15;
  CaseSensitivity CVar17;
  long in_FS_OFFSET;
  bool bVar18;
  QMimeGlobPattern tmp;
  
  lVar6 = *(long *)(in_FS_OFFSET + 0x28);
  pDVar7 = (this->super_QGenericArrayOps<QMimeGlobPattern>).
           super_QArrayDataPointer<QMimeGlobPattern>.d;
  if ((pDVar7 == (Data *)0x0) ||
     (1 < (__int_type_conflict)(pDVar7->super_QArrayData).ref_._q_value.super___atomic_base<int>)) {
LAB_004b62d9:
    pDVar9 = (args->m_pattern).d.d;
    pcVar10 = (args->m_pattern).d.ptr;
    qVar11 = (args->m_pattern).d.size;
    if (pDVar9 != (Data *)0x0) {
      LOCK();
      (pDVar9->super_QArrayData).ref_._q_value.super___atomic_base<int> =
           (__atomic_base<int>)
           ((__int_type_conflict)(pDVar9->super_QArrayData).ref_._q_value.super___atomic_base<int> +
           1);
      UNLOCK();
    }
    pDVar12 = (args->m_mimeType).d.d;
    pcVar13 = (args->m_mimeType).d.ptr;
    qVar14 = (args->m_mimeType).d.size;
    if (pDVar12 != (Data *)0x0) {
      LOCK();
      (pDVar12->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           (pDVar12->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    PVar4 = args->m_patternType;
    uVar5 = args->m_weight;
    uVar16 = args->m_caseSensitivity;
    bVar18 = (this->super_QGenericArrayOps<QMimeGlobPattern>).
             super_QArrayDataPointer<QMimeGlobPattern>.size != 0;
    QArrayDataPointer<QMimeGlobPattern>::detachAndGrow
              ((QArrayDataPointer<QMimeGlobPattern> *)this,(uint)(i == 0 && bVar18),1,
               (QMimeGlobPattern **)0x0,(QArrayDataPointer<QMimeGlobPattern> *)0x0);
    pQVar15 = (this->super_QGenericArrayOps<QMimeGlobPattern>).
              super_QArrayDataPointer<QMimeGlobPattern>.ptr;
    if (i == 0 && bVar18) {
      pQVar15[-1].m_pattern.d.d = pDVar9;
      pQVar15[-1].m_pattern.d.ptr = pcVar10;
      pQVar15[-1].m_pattern.d.size = qVar11;
      pQVar15[-1].m_mimeType.d.d = pDVar12;
      pQVar15[-1].m_mimeType.d.ptr = pcVar13;
      pQVar15[-1].m_mimeType.d.size = qVar14;
      pQVar15[-1].m_weight = uVar5;
      pQVar15[-1].m_caseSensitivity = uVar16;
      pQVar15[-1].m_patternType = PVar4;
      ppQVar1 = &(this->super_QGenericArrayOps<QMimeGlobPattern>).
                 super_QArrayDataPointer<QMimeGlobPattern>.ptr;
      *ppQVar1 = *ppQVar1 + -1;
    }
    else {
      pQVar3 = pQVar15 + i;
      memmove(pQVar3 + 1,pQVar15 + i,
              ((this->super_QGenericArrayOps<QMimeGlobPattern>).
               super_QArrayDataPointer<QMimeGlobPattern>.size - i) * 0x40);
      (pQVar3->m_pattern).d.d = pDVar9;
      (pQVar3->m_pattern).d.ptr = pcVar10;
      (pQVar3->m_pattern).d.size = qVar11;
      (pQVar3->m_mimeType).d.d = pDVar12;
      (pQVar3->m_mimeType).d.ptr = pcVar13;
      (pQVar3->m_mimeType).d.size = qVar14;
      pQVar3->m_weight = uVar5;
      pQVar3->m_caseSensitivity = uVar16;
      pQVar3->m_patternType = PVar4;
    }
    pqVar2 = &(this->super_QGenericArrayOps<QMimeGlobPattern>).
              super_QArrayDataPointer<QMimeGlobPattern>.size;
    *pqVar2 = *pqVar2 + 1;
  }
  else {
    lVar8 = (this->super_QGenericArrayOps<QMimeGlobPattern>).
            super_QArrayDataPointer<QMimeGlobPattern>.size;
    if ((lVar8 == i && pDVar7 != (Data *)0x0) &&
       ((pDVar7->super_QArrayData).alloc !=
        ((long)((long)(this->super_QGenericArrayOps<QMimeGlobPattern>).
                      super_QArrayDataPointer<QMimeGlobPattern>.ptr -
               ((ulong)((long)&pDVar7[1].super_QArrayData.alloc + 7U) & 0xfffffffffffffff0)) >> 6) +
        lVar8)) {
      pQVar15 = (this->super_QGenericArrayOps<QMimeGlobPattern>).
                super_QArrayDataPointer<QMimeGlobPattern>.ptr;
      pDVar9 = (args->m_pattern).d.d;
      pQVar15[lVar8].m_pattern.d.d = pDVar9;
      pQVar15[lVar8].m_pattern.d.ptr = (args->m_pattern).d.ptr;
      pQVar15[lVar8].m_pattern.d.size = (args->m_pattern).d.size;
      if (pDVar9 != (Data *)0x0) {
        LOCK();
        (pDVar9->super_QArrayData).ref_._q_value.super___atomic_base<int> =
             (__atomic_base<int>)
             ((__int_type_conflict)(pDVar9->super_QArrayData).ref_._q_value.super___atomic_base<int>
             + 1);
        UNLOCK();
      }
      pDVar9 = (args->m_mimeType).d.d;
      pQVar15[lVar8].m_mimeType.d.d = pDVar9;
      pQVar15[lVar8].m_mimeType.d.ptr = (args->m_mimeType).d.ptr;
      pQVar15[lVar8].m_mimeType.d.size = (args->m_mimeType).d.size;
      if (pDVar9 != (Data *)0x0) {
        LOCK();
        (pDVar9->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             (pDVar9->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
        UNLOCK();
      }
      pQVar15[lVar8].m_patternType = args->m_patternType;
      CVar17 = args->m_caseSensitivity;
      pQVar15[lVar8].m_weight = args->m_weight;
      pQVar15[lVar8].m_caseSensitivity = CVar17;
    }
    else {
      if (((i != 0) || (pDVar7 == (Data *)0x0)) ||
         ((QMimeGlobPattern *)
          ((ulong)((long)&pDVar7[1].super_QArrayData.alloc + 7U) & 0xfffffffffffffff0) ==
          (this->super_QGenericArrayOps<QMimeGlobPattern>).super_QArrayDataPointer<QMimeGlobPattern>
          .ptr)) goto LAB_004b62d9;
      pQVar15 = (this->super_QGenericArrayOps<QMimeGlobPattern>).
                super_QArrayDataPointer<QMimeGlobPattern>.ptr;
      pDVar9 = (args->m_pattern).d.d;
      pQVar15[-1].m_pattern.d.d = pDVar9;
      pQVar15[-1].m_pattern.d.ptr = (args->m_pattern).d.ptr;
      pQVar15[-1].m_pattern.d.size = (args->m_pattern).d.size;
      if (pDVar9 != (Data *)0x0) {
        LOCK();
        (pDVar9->super_QArrayData).ref_._q_value.super___atomic_base<int> =
             (__atomic_base<int>)
             ((__int_type_conflict)(pDVar9->super_QArrayData).ref_._q_value.super___atomic_base<int>
             + 1);
        UNLOCK();
      }
      pDVar9 = (args->m_mimeType).d.d;
      pQVar15[-1].m_mimeType.d.d = pDVar9;
      pQVar15[-1].m_mimeType.d.ptr = (args->m_mimeType).d.ptr;
      pQVar15[-1].m_mimeType.d.size = (args->m_mimeType).d.size;
      if (pDVar9 != (Data *)0x0) {
        LOCK();
        (pDVar9->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             (pDVar9->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
        UNLOCK();
      }
      pQVar15[-1].m_patternType = args->m_patternType;
      CVar17 = args->m_caseSensitivity;
      pQVar15[-1].m_weight = args->m_weight;
      pQVar15[-1].m_caseSensitivity = CVar17;
      ppQVar1 = &(this->super_QGenericArrayOps<QMimeGlobPattern>).
                 super_QArrayDataPointer<QMimeGlobPattern>.ptr;
      *ppQVar1 = *ppQVar1 + -1;
    }
    pqVar2 = &(this->super_QGenericArrayOps<QMimeGlobPattern>).
              super_QArrayDataPointer<QMimeGlobPattern>.size;
    *pqVar2 = *pqVar2 + 1;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar6) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void emplace(qsizetype i, Args &&... args)
    {
        bool detach = this->needsDetach();
        if (!detach) {
            if (i == this->size && this->freeSpaceAtEnd()) {
                new (this->end()) T(std::forward<Args>(args)...);
                ++this->size;
                return;
            }
            if (i == 0 && this->freeSpaceAtBegin()) {
                new (this->begin() - 1) T(std::forward<Args>(args)...);
                --this->ptr;
                ++this->size;
                return;
            }
        }
        T tmp(std::forward<Args>(args)...);
        const bool growsAtBegin = this->size != 0 && i == 0;
        const auto pos = growsAtBegin ? Data::GrowsAtBeginning : Data::GrowsAtEnd;

        this->detachAndGrow(pos, 1, nullptr, nullptr);
        if (growsAtBegin) {
            Q_ASSERT(this->freeSpaceAtBegin());
            new (this->begin() - 1) T(std::move(tmp));
            --this->ptr;
            ++this->size;
        } else {
            Inserter(this, i, 1).insertOne(std::move(tmp));
        }
    }